

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.hpp
# Opt level: O2

bool __thiscall arm::MemoryOperand::operator==(MemoryOperand *this,MemoryOperand *other)

{
  bool bVar1;
  
  if (this->kind != other->kind) {
    return false;
  }
  if ((this->r1 == other->r1) && (bVar1 = std::operator==(&this->offset,&other->offset), bVar1)) {
    if (*(__index_type *)
         ((long)&(other->offset).super__Variant_base<arm::RegisterOperand,_short>.
                 super__Move_assign_alias<arm::RegisterOperand,_short>.
                 super__Copy_assign_alias<arm::RegisterOperand,_short>.
                 super__Move_ctor_alias<arm::RegisterOperand,_short>.
                 super__Copy_ctor_alias<arm::RegisterOperand,_short>.
                 super__Variant_storage_alias<arm::RegisterOperand,_short> + 0x10) != '\0' ||
        *(__index_type *)
         ((long)&(this->offset).super__Variant_base<arm::RegisterOperand,_short>.
                 super__Move_assign_alias<arm::RegisterOperand,_short>.
                 super__Copy_assign_alias<arm::RegisterOperand,_short>.
                 super__Move_ctor_alias<arm::RegisterOperand,_short>.
                 super__Copy_ctor_alias<arm::RegisterOperand,_short>.
                 super__Variant_storage_alias<arm::RegisterOperand,_short> + 0x10) != '\0') {
      return true;
    }
    return this->neg_rm == other->neg_rm;
  }
  return false;
}

Assistant:

bool operator==(const MemoryOperand& other) const {
    auto r =
        (kind == other.kind) && (r1 == other.r1) && (offset == other.offset);
    if (!r) return r;
    if (offset.index() == other.offset.index() && offset.index() == 0)
      return r && (neg_rm == other.neg_rm);
    else
      return r;
  }